

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O0

int_mv av1_simple_motion_search_sse_var
                 (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize,int ref,
                 FULLPEL_MV start_mv,int num_planes,int use_subpixel,uint *sse,uint *var)

{
  int iVar1;
  MV mi_row_00;
  uint uVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  AV1_COMP *in_RDI;
  BLOCK_SIZE in_R8B;
  int in_R9D;
  int in_stack_00000018;
  uint *in_stack_00000020;
  uint *in_stack_00000028;
  MV subpel_start_mv;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  int not_used;
  int use_subpel_search;
  search_site_config *src_search_sites;
  SEARCH_METHODS search_method;
  MV_SPEED_FEATURES *mv_sf;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  int fine_search_interval;
  FULLPEL_MV_STATS best_mv_stats;
  int bestsme;
  int ref_idx;
  int cost_list [5];
  int step_param;
  MV ref_mv;
  buf_2d backup_yv12;
  YV12_BUFFER_CONFIG *scaled_ref_frame;
  YV12_BUFFER_CONFIG *yv12;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  int_mv best_mv;
  undefined8 in_stack_fffffffffffffd48;
  MV_REFERENCE_FRAME ref_frame;
  SEARCH_METHODS search_method_00;
  MACROBLOCK *in_stack_fffffffffffffd50;
  int_mv *mv;
  AV1_COMP *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined2 in_stack_fffffffffffffd64;
  MV_REFERENCE_FRAME in_stack_fffffffffffffd66;
  BLOCK_SIZE in_stack_fffffffffffffd67;
  bool bVar3;
  MACROBLOCKD *xd_00;
  MACROBLOCK *x_00;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined4 uVar4;
  int in_stack_fffffffffffffd80;
  undefined4 uVar5;
  int in_stack_fffffffffffffd84;
  BLOCK_SIZE bsize_00;
  MACROBLOCK *in_stack_fffffffffffffd88;
  MB_MODE_INFO *ctx;
  int in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  int in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  AV1_COMMON *in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffdac;
  int in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  int in_stack_fffffffffffffdb8;
  MV *in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdd0;
  BLOCK_SIZE in_stack_fffffffffffffdd7;
  MACROBLOCK *in_stack_fffffffffffffdd8;
  AV1_COMP *in_stack_fffffffffffffde0;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffde8;
  FULLPEL_MV in_stack_fffffffffffffdf4;
  search_site_config *in_stack_fffffffffffffe00;
  SEARCH_METHODS in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe10;
  int local_1c0;
  uint local_1bc;
  search_site_config *local_1b8;
  byte local_1a9;
  MV_SPEED_FEATURES *local_1a8;
  FULLPEL_MV_STATS *in_stack_fffffffffffffeb8;
  FULLPEL_MV *in_stack_fffffffffffffec0;
  int *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed4;
  FULLPEL_MOTION_SEARCH_PARAMS *in_stack_fffffffffffffed8;
  FULLPEL_MV in_stack_fffffffffffffee0;
  FULLPEL_MV *in_stack_fffffffffffffef0;
  FULLPEL_MV_STATS local_bc;
  int local_b0;
  undefined4 local_ac;
  int local_a8 [8];
  int local_88;
  undefined1 local_84 [4];
  uint8_t *local_80;
  uint8_t *local_78;
  undefined8 local_70;
  undefined8 local_68;
  YV12_BUFFER_CONFIG *local_60;
  MACROBLOCK *local_58;
  int_interpfilters local_4c;
  MB_MODE_INFO *local_48;
  MACROBLOCKD *local_40;
  AV1_COMMON *local_38;
  int local_30;
  BLOCK_SIZE local_29;
  undefined4 local_28;
  undefined4 local_24;
  long local_20;
  AV1_COMP *local_18;
  int_mv local_c;
  
  ref_frame = (MV_REFERENCE_FRAME)((ulong)in_stack_fffffffffffffd48 >> 0x38);
  local_38 = &in_RDI->common;
  local_40 = (MACROBLOCKD *)(in_RSI + 0x1a0);
  local_30 = in_R9D;
  local_29 = in_R8B;
  local_28 = in_ECX;
  local_24 = in_EDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  set_offsets_for_motion_search
            ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffd88,in_stack_fffffffffffffd84,in_stack_fffffffffffffd80,
             (BLOCK_SIZE)((uint)in_stack_fffffffffffffd7c >> 0x18));
  ctx = *local_40->mi;
  ctx->bsize = local_29;
  ctx->ref_frame[0] = (MV_REFERENCE_FRAME)local_30;
  ctx->ref_frame[1] = -1;
  ctx->motion_mode = '\0';
  local_48 = ctx;
  local_4c = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);
  ctx->interp_filters = local_4c;
  local_58 = (MACROBLOCK *)
             get_ref_frame_yv12_buf
                       ((AV1_COMMON *)
                        CONCAT17(in_stack_fffffffffffffd67,
                                 CONCAT16(in_stack_fffffffffffffd66,
                                          CONCAT24(in_stack_fffffffffffffd64,
                                                   in_stack_fffffffffffffd60))),
                        (MV_REFERENCE_FRAME)((ulong)in_stack_fffffffffffffd58 >> 0x38));
  local_60 = av1_get_scaled_ref_frame
                       ((AV1_COMP *)
                        CONCAT17(in_stack_fffffffffffffd67,
                                 CONCAT16(in_stack_fffffffffffffd66,
                                          CONCAT24(in_stack_fffffffffffffd64,
                                                   in_stack_fffffffffffffd60))),
                        (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
  memset(local_84,0,4);
  if ((local_18->mv_search_params).mv_step_param +
      (local_18->sf).part_sf.simple_motion_search_reduce_search_steps < 9) {
    iVar1 = (local_18->mv_search_params).mv_step_param +
            (local_18->sf).part_sf.simple_motion_search_reduce_search_steps;
  }
  else {
    iVar1 = 9;
  }
  local_ac = 0;
  xd_00 = local_40;
  x_00 = local_58;
  local_88 = iVar1;
  get_ref_scale_factors((AV1_COMMON *)in_stack_fffffffffffffd50,ref_frame);
  search_method_00 = '\0';
  av1_setup_pre_planes
            ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffdac,(YV12_BUFFER_CONFIG *)in_stack_fffffffffffffda0,
             in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,
             (scale_factors *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffdd0);
  set_ref_ptrs((AV1_COMMON *)x_00,xd_00,in_stack_fffffffffffffd67,in_stack_fffffffffffffd66);
  uVar4 = local_24;
  uVar5 = local_28;
  if (local_60 != (YV12_BUFFER_CONFIG *)0x0) {
    local_80 = local_40->plane[0].pre[0].buf;
    local_78 = local_40->plane[0].pre[0].buf0;
    local_70._0_4_ = local_40->plane[0].pre[0].width;
    local_70._4_4_ = local_40->plane[0].pre[0].height;
    local_68 = *(undefined8 *)&local_40->plane[0].pre[0].stride;
    av1_setup_pre_planes
              ((MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               in_stack_fffffffffffffdac,(YV12_BUFFER_CONFIG *)in_stack_fffffffffffffda0,
               in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98,
               (scale_factors *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               in_stack_fffffffffffffdd0);
    uVar4 = local_24;
    uVar5 = local_28;
  }
  use_fine_search_interval(local_18);
  local_1a8 = &(local_18->sf).mv_sf;
  local_1a9 = av1_get_default_mv_search_method
                        (x_00,(MV_SPEED_FEATURES *)xd_00,in_stack_fffffffffffffd67);
  local_1b8 = av1_get_search_site_config
                        (in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,search_method_00);
  mv = (int_mv *)CONCAT44((int)((ulong)in_stack_fffffffffffffd50 >> 0x20),(uint)local_1a9);
  av1_make_default_fullpel_ms_params
            (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
             in_stack_fffffffffffffdd7,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdf4,
             in_stack_fffffffffffffe00,in_stack_fffffffffffffe08,in_stack_fffffffffffffe10);
  cond_cost_list(local_18,local_a8);
  local_b0 = av1_full_pixel_search
                       (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                        in_stack_fffffffffffffed4,in_stack_fffffffffffffec8,
                        in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                        in_stack_fffffffffffffef0);
  bVar3 = false;
  if (((local_b0 < 0x7fffffff) &&
      (bVar3 = false, ((local_18->common).features.cur_frame_force_integer_mv & 1U) == 0)) &&
     (bVar3 = false, in_stack_00000018 != 0)) {
    bVar3 = (local_18->sf).mv_sf.simple_motion_subpel_force_stop != '\x03';
  }
  local_1bc = (uint)bVar3;
  if (local_60 != (YV12_BUFFER_CONFIG *)0x0) {
    local_40->plane[0].pre[0].buf = local_80;
    local_40->plane[0].pre[0].buf0 = local_78;
    local_40->plane[0].pre[0].width = (undefined4)local_70;
    local_40->plane[0].pre[0].height = local_70._4_4_;
    *(undefined8 *)&local_40->plane[0].pre[0].stride = local_68;
  }
  if (local_1bc == 0) {
    convert_fullmv_to_mv(mv);
    *in_stack_00000028 = local_bc.distortion;
    *in_stack_00000020 = local_bc.sse;
  }
  else {
    local_1c0 = 0;
    av1_make_default_subpel_ms_params
              ((SUBPEL_MOTION_SEARCH_PARAMS *)in_stack_fffffffffffffda0,
               (AV1_COMP *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
               (BLOCK_SIZE)((ulong)ctx >> 0x38),(MV *)CONCAT44(iVar1,uVar5),
               (int *)CONCAT44(uVar4,in_stack_fffffffffffffd78));
    bsize_00 = (BLOCK_SIZE)((uint)iVar1 >> 0x18);
    mi_row_00 = get_mv_from_fullmv(&local_c.as_fullmv);
    (*(local_18->mv_search_params).find_fractional_mv_step)
              (local_40,local_38,(SUBPEL_MOTION_SEARCH_PARAMS *)&stack0xfffffffffffffd98,mi_row_00,
               &local_bc,&local_c.as_mv,&local_1c0,(uint *)(local_20 + 0x25660 + (long)local_30 * 4)
               ,(int_mv *)0x0);
    local_48->mv[0] = local_c;
    av1_enc_build_inter_predictor
              (in_stack_fffffffffffffda0,
               (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               (int)mi_row_00,in_stack_fffffffffffffd90,(BUFFER_SET *)ctx,bsize_00,
               in_stack_fffffffffffffdb0,in_stack_fffffffffffffdb8);
    uVar2 = (*local_18->ppi->fn_ptr[local_29].vf)
                      (*(uint8_t **)(local_20 + 0x30),*(int *)(local_20 + 0x48),
                       local_40->plane[0].dst.buf,local_40->plane[0].dst.stride,in_stack_00000020);
    *in_stack_00000028 = uVar2;
  }
  return (int_mv)local_c.as_int;
}

Assistant:

int_mv av1_simple_motion_search_sse_var(AV1_COMP *const cpi, MACROBLOCK *x,
                                        int mi_row, int mi_col,
                                        BLOCK_SIZE bsize, int ref,
                                        FULLPEL_MV start_mv, int num_planes,
                                        int use_subpixel, unsigned int *sse,
                                        unsigned int *var) {
  assert(num_planes == 1 &&
         "Currently simple_motion_search only supports luma plane");
  assert(!frame_is_intra_only(&cpi->common) &&
         "Simple motion search only enabled for non-key frames");
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;

  set_offsets_for_motion_search(cpi, x, mi_row, mi_col, bsize);

  MB_MODE_INFO *mbmi = xd->mi[0];
  mbmi->bsize = bsize;
  mbmi->ref_frame[0] = ref;
  mbmi->ref_frame[1] = NONE_FRAME;
  mbmi->motion_mode = SIMPLE_TRANSLATION;
  mbmi->interp_filters = av1_broadcast_interp_filter(EIGHTTAP_REGULAR);

  const YV12_BUFFER_CONFIG *yv12 = get_ref_frame_yv12_buf(cm, ref);
  const YV12_BUFFER_CONFIG *scaled_ref_frame =
      av1_get_scaled_ref_frame(cpi, ref);
  struct buf_2d backup_yv12;
  // ref_mv is used to calculate the cost of the motion vector
  const MV ref_mv = kZeroMv;
  const int step_param =
      AOMMIN(cpi->mv_search_params.mv_step_param +
                 cpi->sf.part_sf.simple_motion_search_reduce_search_steps,
             MAX_MVSEARCH_STEPS - 2);
  int cost_list[5];
  const int ref_idx = 0;
  int bestsme;
  int_mv best_mv;
  FULLPEL_MV_STATS best_mv_stats;

  av1_setup_pre_planes(xd, ref_idx, yv12, mi_row, mi_col,
                       get_ref_scale_factors(cm, ref), num_planes);
  set_ref_ptrs(cm, xd, mbmi->ref_frame[0], mbmi->ref_frame[1]);
  if (scaled_ref_frame) {
    backup_yv12 = xd->plane[AOM_PLANE_Y].pre[ref_idx];
    av1_setup_pre_planes(xd, ref_idx, scaled_ref_frame, mi_row, mi_col, NULL,
                         num_planes);
  }

  // Allow more mesh searches for screen content type on the ARF.
  const int fine_search_interval = use_fine_search_interval(cpi);
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  const MV_SPEED_FEATURES *mv_sf = &cpi->sf.mv_sf;
  const SEARCH_METHODS search_method =
      av1_get_default_mv_search_method(x, mv_sf, bsize);
  const search_site_config *src_search_sites =
      av1_get_search_site_config(cpi, x, search_method);
  av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize, &ref_mv,
                                     start_mv, src_search_sites, search_method,
                                     fine_search_interval);

  bestsme = av1_full_pixel_search(start_mv, &full_ms_params, step_param,
                                  cond_cost_list(cpi, cost_list),
                                  &best_mv.as_fullmv, &best_mv_stats, NULL);

  const int use_subpel_search =
      bestsme < INT_MAX && !cpi->common.features.cur_frame_force_integer_mv &&
      use_subpixel &&
      (cpi->sf.mv_sf.simple_motion_subpel_force_stop != FULL_PEL);
  if (scaled_ref_frame) {
    xd->plane[AOM_PLANE_Y].pre[ref_idx] = backup_yv12;
  }
  if (use_subpel_search) {
    int not_used = 0;

    SUBPEL_MOTION_SEARCH_PARAMS ms_params;
    av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize, &ref_mv,
                                      cost_list);
    // TODO(yunqing): integrate this into av1_make_default_subpel_ms_params().
    ms_params.forced_stop = mv_sf->simple_motion_subpel_force_stop;

    MV subpel_start_mv = get_mv_from_fullmv(&best_mv.as_fullmv);
    assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv));

    cpi->mv_search_params.find_fractional_mv_step(
        xd, cm, &ms_params, subpel_start_mv, &best_mv_stats, &best_mv.as_mv,
        &not_used, &x->pred_sse[ref], NULL);

    mbmi->mv[0] = best_mv;

    // Get a copy of the prediction output
    av1_enc_build_inter_predictor(cm, xd, mi_row, mi_col, NULL, bsize,
                                  AOM_PLANE_Y, AOM_PLANE_Y);
    *var = cpi->ppi->fn_ptr[bsize].vf(
        x->plane[0].src.buf, x->plane[0].src.stride, xd->plane[0].dst.buf,
        xd->plane[0].dst.stride, sse);
  } else {
    // Manually convert from units of pixel to 1/8-pixels if we are not doing
    // subpel search
    convert_fullmv_to_mv(&best_mv);
    *var = best_mv_stats.distortion;
    *sse = best_mv_stats.sse;
  }

  return best_mv;
}